

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseNCName(xmlParserCtxtPtr ctxt)

{
  byte *pbVar1;
  int len;
  xmlChar *pxVar2;
  bool bVar3;
  int count;
  xmlChar *ret;
  xmlChar *e;
  xmlChar *in;
  xmlParserCtxtPtr ctxt_local;
  
  e = ctxt->input->cur;
  pbVar1 = ctxt->input->end;
  if (((((0x60 < *e) && (*e < 0x7b)) || ((0x40 < *e && (*e < 0x5b)))) || (*e == 0x5f)) &&
     (e < pbVar1)) {
    do {
      e = e + 1;
      if (((0x60 < *e) && (*e < 0x7b)) ||
         (((0x40 < *e && (*e < 0x5b)) ||
          ((((0x2f < *e && (*e < 0x3a)) || (*e == '_')) ||
           ((*e == '-' || (bVar3 = false, *e == '.')))))))) {
        bVar3 = e < pbVar1;
      }
    } while (bVar3);
    if (((e < pbVar1) && (*e != '\0')) && (*e < 0x80)) {
      len = (int)e - (int)ctxt->input->cur;
      if ((50000 < len) && ((ctxt->options & 0x80000U) == 0)) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
        return (xmlChar *)0x0;
      }
      pxVar2 = xmlDictLookup(ctxt->dict,ctxt->input->cur,len);
      ctxt->input->cur = e;
      ctxt->input->col = len + ctxt->input->col;
      if (pxVar2 != (xmlChar *)0x0) {
        return pxVar2;
      }
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
  }
  pxVar2 = xmlParseNCNameComplex(ctxt);
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlParseNCName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in, *e;
    const xmlChar *ret;
    int count = 0;

#ifdef DEBUG
    nbParseNCName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    e = ctxt->input->end;
    if ((((*in >= 0x61) && (*in <= 0x7A)) ||
	 ((*in >= 0x41) && (*in <= 0x5A)) ||
	 (*in == '_')) && (in < e)) {
	in++;
	while ((((*in >= 0x61) && (*in <= 0x7A)) ||
	        ((*in >= 0x41) && (*in <= 0x5A)) ||
	        ((*in >= 0x30) && (*in <= 0x39)) ||
	        (*in == '_') || (*in == '-') ||
	        (*in == '.')) && (in < e))
	    in++;
	if (in >= e)
	    goto complex;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if ((count > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL) {
	        xmlErrMemory(ctxt, NULL);
	    }
	    return(ret);
	}
    }
complex:
    return(xmlParseNCNameComplex(ctxt));
}